

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

bool __thiscall
basisu::vector<basist::ktx2_transcoder::key_value>::try_reserve
          (vector<basist::ktx2_transcoder::key_value> *this,size_t new_capacity_size_t)

{
  key_value *pkVar1;
  undefined8 uVar2;
  bool bVar3;
  uint min_new_capacity;
  vector<basist::ktx2_transcoder::key_value> local_28;
  
  if (new_capacity_size_t >> 0x20 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x1fa,
                  "bool basisu::vector<basist::ktx2_transcoder::key_value>::try_reserve(size_t) [T = basist::ktx2_transcoder::key_value]"
                 );
  }
  min_new_capacity = (uint)new_capacity_size_t;
  if (this->m_capacity < min_new_capacity) {
    bVar3 = increase_capacity(this,min_new_capacity,false,false);
    if (!bVar3) {
      return false;
    }
  }
  else if (min_new_capacity < this->m_capacity) {
    local_28.m_p = (key_value *)0x0;
    local_28.m_size = 0;
    local_28.m_capacity = 0;
    if (min_new_capacity < this->m_size) {
      min_new_capacity = this->m_size;
    }
    increase_capacity(&local_28,min_new_capacity,false,false);
    operator=(&local_28,this);
    pkVar1 = this->m_p;
    this->m_p = local_28.m_p;
    uVar2._0_4_ = this->m_size;
    uVar2._4_4_ = this->m_capacity;
    this->m_size = local_28.m_size;
    this->m_capacity = local_28.m_capacity;
    local_28.m_p = pkVar1;
    local_28._8_8_ = uVar2;
    ~vector(&local_28);
  }
  return true;
}

Assistant:

inline bool try_reserve(size_t new_capacity_size_t)
      {
         if (new_capacity_size_t > UINT32_MAX)
         {
            assert(0);
            return false;
         }

         uint32_t new_capacity = (uint32_t)new_capacity_size_t;

         if (new_capacity > m_capacity)
         {
            if (!increase_capacity(new_capacity, false))
               return false;
         }
         else if (new_capacity < m_capacity)
         {
            // Must work around the lack of a "decrease_capacity()" method.
            // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
            vector tmp;
            tmp.increase_capacity(helpers::maximum(m_size, new_capacity), false);
            tmp = *this;
            swap(tmp);
         }

         return true;
      }